

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int __thiscall ON_String::Remove(ON_String *this,char utf8_single_byte_c)

{
  char *pcVar1;
  int iVar2;
  ON_aStringHeader *pOVar3;
  int nCount;
  char *pstrEnd;
  char *pstrDest;
  char *pstrSource;
  char utf8_single_byte_c_local;
  ON_String *this_local;
  
  iVar2 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c);
  if (iVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    CopyArray(this);
    pstrDest = this->m_s;
    pstrEnd = this->m_s;
    pcVar1 = this->m_s;
    iVar2 = Length(this);
    for (; pstrDest != (char *)0x0 && pstrDest < pcVar1 + iVar2; pstrDest = pstrDest + 1) {
      if (*pstrDest != utf8_single_byte_c) {
        *pstrEnd = *pstrDest;
        pstrEnd = pstrEnd + 1;
      }
    }
    *pstrEnd = '\0';
    this_local._4_4_ = (int)pstrDest - (int)pstrEnd;
    pOVar3 = Header(this);
    pOVar3->string_length = pOVar3->string_length - this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int ON_String::Remove(const char utf8_single_byte_c)
{
  if (false == ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c))
    return 0;

  CopyArray();

  char* pstrSource = m_s;
  char* pstrDest = m_s;
  char* pstrEnd = m_s + Length();

  while( pstrSource && pstrSource  < pstrEnd)
  {
    if (*pstrSource != utf8_single_byte_c)
    {
      *pstrDest = *pstrSource;
      pstrDest++;
    }
    pstrSource++;
  }

  *pstrDest = 0;
  int nCount = (int)(pstrSource - pstrDest); // the (int) is for 64 bit size_t conversion

  Header()->string_length -= nCount;

  return nCount;
}